

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void __thiscall
bk_lib::pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
::reserve(pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
          *this,size_type n)

{
  pointer ppVar1;
  pair<Clasp::Literal,_int> *__dest;
  
  if ((this->ebo_).cap < n) {
    __dest = __gnu_cxx::new_allocator<std::pair<Clasp::Literal,_int>_>::allocate
                       ((new_allocator<std::pair<Clasp::Literal,_int>_> *)this,(ulong)n,(void *)0x0)
    ;
    ppVar1 = (this->ebo_).buf;
    if (ppVar1 != (pointer)0x0) {
      memcpy(__dest,ppVar1,(ulong)(this->ebo_).size << 3);
    }
    ppVar1 = (this->ebo_).buf;
    if (ppVar1 != (pointer)0x0) {
      operator_delete(ppVar1);
    }
    (this->ebo_).buf = __dest;
    (this->ebo_).cap = n;
  }
  return;
}

Assistant:

void reserve(size_type n) {
		if (n > capacity()) {
			T* temp = ebo_.allocate(n);
			if (ebo_.buf) {
				std::memcpy(temp, ebo_.buf, size()*sizeof(T));
			}
			ebo_.release();
			ebo_.buf = temp;
			ebo_.cap = n;
		}
	}